

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

SortNode * __thiscall GLDrawList::SortSpriteList(GLDrawList *this,SortNode *head)

{
  SortNode *pSVar1;
  SortNode **ppSVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  SortNode *pSVar6;
  SortNode *local_30;
  
  if (SortSpriteList(SortNode*)::sortspritelist == '\0') {
    iVar3 = __cxa_guard_acquire(&SortSpriteList(SortNode*)::sortspritelist);
    if (iVar3 != 0) {
      SortSpriteList::sortspritelist = (TArray<SortNode_*,_SortNode_*>)ZEXT816(0);
      __cxa_atexit(TArray<SortNode_*,_SortNode_*>::~TArray,&SortSpriteList::sortspritelist,
                   &__dso_handle);
      __cxa_guard_release(&SortSpriteList(SortNode*)::sortspritelist);
    }
  }
  pSVar6 = head->parent;
  TArray<SortNode_*,_SortNode_*>::Clear(&SortSpriteList::sortspritelist);
  while (local_30 = head, head != (SortNode *)0x0) {
    TArray<SortNode_*,_SortNode_*>::Push(&SortSpriteList::sortspritelist,&local_30);
    head = local_30->next;
  }
  gd = this;
  qsort(SortSpriteList::sortspritelist.Array,(ulong)SortSpriteList::sortspritelist.Count,8,
        CompareSprite);
  uVar4 = (ulong)SortSpriteList::sortspritelist.Count;
  ppSVar2 = SortSpriteList::sortspritelist.Array;
  for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
    ppSVar2[uVar5]->next = (SortNode *)0x0;
    pSVar1 = ppSVar2[uVar5];
    if (pSVar6 != (SortNode *)0x0) {
      pSVar6->equal = pSVar1;
    }
    pSVar6 = pSVar1;
  }
  return *ppSVar2;
}

Assistant:

SortNode * GLDrawList::SortSpriteList(SortNode * head)
{
	SortNode * n;
	int count;
	unsigned i;

	static TArray<SortNode*> sortspritelist;

	SortNode * parent=head->parent;

	sortspritelist.Clear();
	for(count=0,n=head;n;n=n->next) sortspritelist.Push(n);
	gd=this;
	qsort(&sortspritelist[0],sortspritelist.Size(),sizeof(SortNode *),CompareSprite);
	for(i=0;i<sortspritelist.Size();i++)
	{
		sortspritelist[i]->next=NULL;
		if (parent) parent->equal=sortspritelist[i];
		parent=sortspritelist[i];
	}
	return sortspritelist[0];
}